

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.cpp
# Opt level: O1

bool __thiscall pstore::indirect_string::operator<(indirect_string *this,indirect_string *rhs)

{
  bool bVar1;
  size_t slen;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  raw_sstring_view rVar7;
  raw_sstring_view rVar8;
  shared_sstring_view rhs_owner;
  shared_sstring_view lhs_owner;
  sstring_view<std::shared_ptr<const_char>_> local_78;
  sstring_view<std::shared_ptr<const_char>_> local_58;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_38;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_30;
  
  if (this->db_ != rhs->db_) {
    assert_failed("&db_ == &rhs.db_",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/indirect_string.cpp"
                  ,0x38);
  }
  local_30.ptr_ = &local_58;
  local_58.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_58.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58.size_ = 0;
  local_78.size_ = 0;
  local_78.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_78.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::ensure_invariant(&local_30);
  rVar7 = as_string_view(this,local_30);
  uVar2 = rVar7.size_;
  local_38.ptr_ = &local_78;
  gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::ensure_invariant(&local_38);
  rVar8 = as_string_view(rhs,local_38);
  uVar3 = rVar8.size_;
  uVar5 = uVar2;
  if (uVar3 < uVar2) {
    uVar5 = uVar3;
  }
  bVar1 = true;
  if (uVar5 == 0) {
    bVar4 = 0;
  }
  else {
    uVar6 = 0;
    bVar4 = 0;
    do {
      if (rVar7.ptr_[uVar6] < rVar8.ptr_[uVar6]) {
        bVar4 = 0xff;
LAB_00113dea:
        bVar1 = false;
        break;
      }
      if (rVar8.ptr_[uVar6] < rVar7.ptr_[uVar6]) {
        bVar4 = 0;
        goto LAB_00113dea;
      }
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  if ((bVar1) && (bVar4 = 0, uVar2 != uVar3)) {
    bVar4 = (byte)(-(uint)(uVar2 < uVar3) >> 0x18);
  }
  if (local_78.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_58.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return (bool)(bVar4 >> 7);
}

Assistant:

bool indirect_string::operator< (indirect_string const & rhs) const {
        PSTORE_ASSERT (&db_ == &rhs.db_);
        shared_sstring_view lhs_owner;
        shared_sstring_view rhs_owner;
        return this->as_string_view (&lhs_owner) < rhs.as_string_view (&rhs_owner);
    }